

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserUtils.h
# Opt level: O0

bool ODDLParser::isInteger<char>(char *in,char *end)

{
  bool bVar1;
  bool local_19;
  bool result;
  char *end_local;
  char *in_local;
  
  end_local = in;
  if ((in != end) && (*in == '-')) {
    end_local = in + 1;
  }
  local_19 = false;
  while ((bVar1 = isNotEndOfToken<char>(end_local,end), bVar1 &&
         (local_19 = isNumeric<char>(*end_local), local_19))) {
    end_local = end_local + 1;
  }
  return local_19;
}

Assistant:

inline
bool isInteger( T *in, T *end ) {
    if( in != end ) {
        if( *in == '-' ) {
            ++in;
        }
    }

    bool result( false );
    while( isNotEndOfToken( in, end ) ) {
        result = isNumeric( *in );
        if( !result ) {
            break;
        }
        ++in;
    }

    return result;
}